

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O0

void ect_train(ect *e,single_learner *base,example *ec)

{
  undefined4 uVar1;
  undefined8 uVar2;
  bool bVar3;
  direction *pdVar4;
  size_t sVar5;
  ostream *this;
  bool *pbVar6;
  bool **ppbVar7;
  long in_RDX;
  long *in_RDI;
  bool bVar8;
  uint32_t problem_number;
  bool right;
  bool left_1;
  uint32_t j;
  size_t i;
  bool won;
  float old_weight;
  bool left;
  uint32_t id;
  label_data simple_temp;
  label_t mc;
  bool *in_stack_ffffffffffffff58;
  v_array<bool> *in_stack_ffffffffffffff60;
  example *in_stack_ffffffffffffff68;
  v_array<bool> *in_stack_ffffffffffffff70;
  uint local_4c;
  ulong local_48;
  uint local_30;
  float local_2c;
  undefined4 uStack_28;
  int local_20;
  
  if (*in_RDI != 1) {
    uVar2 = *(undefined8 *)(in_RDX + 0x6828);
    v_array<bool>::clear(in_stack_ffffffffffffff60);
    local_20 = (int)uVar2;
    pdVar4 = v_array<direction>::operator[]
                       ((v_array<direction> *)(in_RDI + 3),(ulong)(local_20 - 1));
    local_30 = pdVar4->winner;
    pdVar4 = v_array<direction>::operator[]((v_array<direction> *)(in_RDI + 3),(ulong)local_30);
    bVar8 = pdVar4->left == local_20 - 1U;
    do {
      if (bVar8) {
        local_2c = -1.0;
      }
      else {
        local_2c = 1.0;
      }
      *(ulong *)(in_RDX + 0x6828) = CONCAT44(uStack_28,local_2c);
      *(undefined4 *)(in_RDX + 0x6830) = 0;
      LEARNER::learner<char,_example>::learn
                ((learner<char,_example> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 (size_t)in_stack_ffffffffffffff60);
      uVar1 = *(undefined4 *)(in_RDX + 0x6870);
      *(undefined4 *)(in_RDX + 0x6870) = 0;
      LEARNER::learner<char,_example>::learn
                ((learner<char,_example> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 (size_t)in_stack_ffffffffffffff60);
      *(undefined4 *)(in_RDX + 0x6870) = uVar1;
      if ((*(float *)(in_RDX + 0x6850) - *(float *)(in_RDI + 2)) * local_2c <= 0.0) {
        pdVar4 = v_array<direction>::operator[]((v_array<direction> *)(in_RDI + 3),(ulong)local_30);
        if ((pdVar4->last & 1U) == 0) {
          pdVar4 = v_array<direction>::operator[]
                             ((v_array<direction> *)(in_RDI + 3),(ulong)local_30);
          pdVar4 = v_array<direction>::operator[]
                             ((v_array<direction> *)(in_RDI + 3),(ulong)pdVar4->loser);
          bVar8 = pdVar4->left == local_30;
          pdVar4 = v_array<direction>::operator[]
                             ((v_array<direction> *)(in_RDI + 3),(ulong)local_30);
          if (pdVar4->loser == 0) {
            v_array<bool>::push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          }
        }
        else {
          v_array<bool>::push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
        pdVar4 = v_array<direction>::operator[]((v_array<direction> *)(in_RDI + 3),(ulong)local_30);
        local_30 = pdVar4->loser;
      }
      else {
        pdVar4 = v_array<direction>::operator[]((v_array<direction> *)(in_RDI + 3),(ulong)local_30);
        if ((pdVar4->last & 1U) == 0) {
          pdVar4 = v_array<direction>::operator[]
                             ((v_array<direction> *)(in_RDI + 3),(ulong)local_30);
          pdVar4 = v_array<direction>::operator[]
                             ((v_array<direction> *)(in_RDI + 3),(ulong)pdVar4->winner);
          bVar8 = pdVar4->left == local_30;
        }
        else {
          v_array<bool>::push_back(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
        pdVar4 = v_array<direction>::operator[]((v_array<direction> *)(in_RDI + 3),(ulong)local_30);
        local_30 = pdVar4->winner;
      }
    } while (local_30 != 0);
    sVar5 = v_array<bool>::size((v_array<bool> *)(in_RDI + 0x19));
    if (sVar5 == 0) {
      this = std::operator<<((ostream *)&std::cout,"badness!");
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    for (local_48 = 0; local_48 < (ulong)in_RDI[0x17]; local_48 = local_48 + 1) {
      for (local_4c = 0; sVar5 = v_array<bool>::size((v_array<bool> *)(in_RDI + 0x19)),
          (ulong)local_4c < sVar5 >> 1; local_4c = local_4c + 1) {
        pbVar6 = v_array<bool>::operator[]((v_array<bool> *)(in_RDI + 0x19),(ulong)(local_4c << 1));
        bVar3 = (bool)(*pbVar6 & 1);
        pbVar6 = v_array<bool>::operator[]
                           ((v_array<bool> *)(in_RDI + 0x19),(ulong)(local_4c * 2 + 1));
        bVar8 = *pbVar6;
        if (bVar3 == (bool)(bVar8 & 1U)) {
          pbVar6 = v_array<bool>::operator[]((v_array<bool> *)(in_RDI + 0x19),(ulong)local_4c);
          *pbVar6 = bVar3;
        }
        else {
          if (bVar3 == false) {
            local_2c = 1.0;
          }
          else {
            local_2c = -1.0;
          }
          *(ulong *)(in_RDX + 0x6828) =
               CONCAT44((float)(1 << (((char)in_RDI[0x17] - (char)local_48) - 1U & 0x1f)),local_2c);
          *(undefined4 *)(in_RDX + 0x6830) = 0;
          LEARNER::learner<char,_example>::learn
                    ((learner<char,_example> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (size_t)in_stack_ffffffffffffff60);
          if (*(float *)(in_RDX + 0x6850) < *(float *)(in_RDI + 2) ||
              *(float *)(in_RDX + 0x6850) == *(float *)(in_RDI + 2)) {
            pbVar6 = v_array<bool>::operator[]((v_array<bool> *)(in_RDI + 0x19),(ulong)local_4c);
            *pbVar6 = bVar3;
          }
          else {
            pbVar6 = v_array<bool>::operator[]((v_array<bool> *)(in_RDI + 0x19),(ulong)local_4c);
            *pbVar6 = (bool)(bVar8 & 1U);
          }
        }
        sVar5 = v_array<bool>::size((v_array<bool> *)(in_RDI + 0x19));
        if ((sVar5 & 1) == 1) {
          in_stack_ffffffffffffff70 = (v_array<bool> *)(in_RDI + 0x19);
          sVar5 = v_array<bool>::size((v_array<bool> *)(in_RDI + 0x19));
          pbVar6 = v_array<bool>::operator[](in_stack_ffffffffffffff70,sVar5 - 1);
          bVar8 = *pbVar6;
          sVar5 = v_array<bool>::size((v_array<bool> *)(in_RDI + 0x19));
          pbVar6 = v_array<bool>::operator[]((v_array<bool> *)(in_RDI + 0x19),sVar5 >> 1);
          *pbVar6 = (bool)(bVar8 & 1);
        }
        ppbVar7 = v_array<bool>::begin((v_array<bool> *)(in_RDI + 0x19));
        in_stack_ffffffffffffff60 = (v_array<bool> *)*ppbVar7;
        sVar5 = v_array<bool>::size((v_array<bool> *)(in_RDI + 0x19));
        in_stack_ffffffffffffff68 =
             (example *)((long)&in_stack_ffffffffffffff60->_begin + (sVar5 + 1 >> 1));
        ppbVar7 = v_array<bool>::end((v_array<bool> *)(in_RDI + 0x19));
        *ppbVar7 = (bool *)in_stack_ffffffffffffff68;
      }
    }
  }
  return;
}

Assistant:

void ect_train(ect& e, single_learner& base, example& ec)
{
  if (e.k == 1)  // nothing to do
    return;
  MULTICLASS::label_t mc = ec.l.multi;

  label_data simple_temp;

  simple_temp.initial = 0.;

  e.tournaments_won.clear();

  uint32_t id = e.directions[mc.label - 1].winner;
  bool left = e.directions[id].left == mc.label - 1;
  do
  {
    if (left)
      simple_temp.label = -1;
    else
      simple_temp.label = 1;

    ec.l.simple = simple_temp;
    base.learn(ec, id - e.k);
    float old_weight = ec.weight;
    ec.weight = 0.;
    base.learn(ec, id - e.k);  // inefficient, we should extract final prediction exactly.
    ec.weight = old_weight;

    bool won = (ec.pred.scalar - e.class_boundary) * simple_temp.label > 0;

    if (won)
    {
      if (!e.directions[id].last)
        left = e.directions[e.directions[id].winner].left == id;
      else
        e.tournaments_won.push_back(true);
      id = e.directions[id].winner;
    }
    else
    {
      if (!e.directions[id].last)
      {
        left = e.directions[e.directions[id].loser].left == id;
        if (e.directions[id].loser == 0)
          e.tournaments_won.push_back(false);
      }
      else
        e.tournaments_won.push_back(false);
      id = e.directions[id].loser;
    }
  } while (id != 0);

  if (e.tournaments_won.size() < 1)
    cout << "badness!" << endl;

  // tournaments_won is a bit vector determining which tournaments the label won.
  for (size_t i = 0; i < e.tree_height; i++)
  {
    for (uint32_t j = 0; j < e.tournaments_won.size() / 2; j++)
    {
      bool left = e.tournaments_won[j * 2];
      bool right = e.tournaments_won[j * 2 + 1];
      if (left == right)  // no query to do
        e.tournaments_won[j] = left;
      else  // query to do
      {
        if (left)
          simple_temp.label = -1;
        else
          simple_temp.label = 1;
        simple_temp.weight = (float)(1 << (e.tree_height - i - 1));
        ec.l.simple = simple_temp;

        uint32_t problem_number = e.last_pair + j * (1 << (i + 1)) + (1 << i) - 1;

        base.learn(ec, problem_number);

        if (ec.pred.scalar > e.class_boundary)
          e.tournaments_won[j] = right;
        else
          e.tournaments_won[j] = left;
      }
      if (e.tournaments_won.size() % 2 == 1)
        e.tournaments_won[e.tournaments_won.size() / 2] = e.tournaments_won[e.tournaments_won.size() - 1];
      e.tournaments_won.end() = e.tournaments_won.begin() + (1 + e.tournaments_won.size()) / 2;
    }
  }
}